

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall random_tests::fastrandom_randbits::test_method(fastrandom_randbits *this)

{
  long lVar1;
  uint64_t uVar2;
  unsigned_long uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  assertion_result *paVar5;
  ulong range;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar9;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  assertion_result local_1d0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  lazy_ostream local_188;
  undefined1 *local_178;
  char **local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx1,false);
  FastRandomContext::FastRandomContext(&ctx2,false);
  for (lVar6 = 0; lVar6 != 0x3f; lVar6 = lVar6 + 1) {
    iVar7 = 1000;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      uVar2 = RandomMixin<FastRandomContext>::randbits
                        (&ctx1.super_RandomMixin<FastRandomContext>,(int)lVar6);
      local_158 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_150 = "";
      local_168 = &boost::unit_test::basic_cstring<char_const>::null;
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x7a;
      file.m_begin = (iterator)&local_158;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_168,msg)
      ;
      local_188.m_empty = false;
      local_188._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
      local_178 = boost::unit_test::lazy_ostream::inst;
      local_170 = (char **)0xc7f1cc;
      local_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_190 = "";
      local_1d0._0_8_ = uVar2 >> ((byte)lVar6 & 0x3f);
      local_1e0 = (char *)((ulong)local_1e0 & 0xffffffff00000000);
      pvVar4 = (iterator)0x2;
      paVar5 = &local_1d0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_188,&local_198,0x7a,1,2,paVar5,"rangebits >> bits",&local_1e0,"0U");
      range = uVar2 | 1L << ((byte)lVar6 & 0x3f);
      uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (&ctx2.super_RandomMixin<FastRandomContext>,range);
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_1a0 = "";
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar9 = 0x44d6d1;
      file_00.m_end = (iterator)0x7d;
      file_00.m_begin = (iterator)&local_1a8;
      msg_00.m_end = (iterator)paVar5;
      msg_00.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
                 msg_00);
      local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(uVar3 < range);
      local_1d0.m_message.px = (element_type *)0x0;
      local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1e0 = "rand < range";
      local_1d8 = "";
      local_188.m_empty = false;
      local_188._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
      local_178 = boost::unit_test::lazy_ostream::inst;
      local_170 = &local_1e0;
      local_1f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_1e8 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1d0,&local_188,1,0,WARN,_cVar9,(size_t)&local_1f0,0x7d);
      boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
    }
  }
  ChaCha20::~ChaCha20(&ctx2.rng);
  ChaCha20::~ChaCha20(&ctx1.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_randbits)
{
    FastRandomContext ctx1;
    FastRandomContext ctx2;
    for (int bits = 0; bits < 63; ++bits) {
        for (int j = 0; j < 1000; ++j) {
            uint64_t rangebits = ctx1.randbits(bits);
            BOOST_CHECK_EQUAL(rangebits >> bits, 0U);
            uint64_t range = (uint64_t{1}) << bits | rangebits;
            uint64_t rand = ctx2.randrange(range);
            BOOST_CHECK(rand < range);
        }
    }
}